

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsExport.cpp
# Opt level: O0

HelicsCore helicsCreateCore(char *type,char *name,char *initString,HelicsError *err)

{
  string_view configureString;
  string_view newError;
  bool bVar1;
  CoreType CVar2;
  char *pcVar3;
  pointer pCVar4;
  element_type *this;
  int *in_RCX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  void *retcore;
  string_view nstring;
  __single_object core;
  CoreType coretype;
  shared_ptr<helics::Core> *in_stack_fffffffffffffe58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe68;
  undefined4 in_stack_fffffffffffffe70;
  undefined4 in_stack_fffffffffffffe74;
  undefined8 in_stack_fffffffffffffe78;
  CoreType type_00;
  size_t in_stack_fffffffffffffe80;
  char *in_stack_fffffffffffffe88;
  MasterObjectHolder *this_00;
  undefined4 in_stack_fffffffffffffe98;
  CoreType CVar5;
  MasterObjectHolder *in_stack_fffffffffffffea0;
  CoreType in_stack_fffffffffffffeec;
  string_view in_stack_fffffffffffffef0;
  string_view in_stack_ffffffffffffff00;
  __sv_type local_f0 [2];
  string_view in_stack_ffffffffffffff60;
  pointer local_8;
  
  type_00 = (CoreType)((ulong)in_stack_fffffffffffffe78 >> 0x20);
  if ((in_RCX == (int *)0x0) || (*in_RCX == 0)) {
    if (in_RDI == 0) {
      CVar2 = DEFAULT;
    }
    else {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)
                 CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
                 (char *)in_stack_fffffffffffffe68);
      CVar2 = helics::core::coreTypeFromString(in_stack_ffffffffffffff60);
    }
    if (CVar2 == UNRECOGNIZED) {
      if (in_RCX != (int *)0x0) {
        *in_RCX = -4;
        getMasterHolder();
        std::__shared_ptr_access<MasterObjectHolder,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<MasterObjectHolder,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x19e8b5);
        this_00 = (MasterObjectHolder *)&stack0xffffffffffffff3f;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffea0,(char *)CONCAT44(CVar2,in_stack_fffffffffffffe98),
                   (allocator<char> *)this_00);
        std::operator+(in_stack_fffffffffffffe68,(char *)in_stack_fffffffffffffe60);
        std::operator+(in_stack_fffffffffffffe68,(char *)in_stack_fffffffffffffe60);
        std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffffe60);
        newError._M_len._4_4_ = CVar2;
        newError._M_len._0_4_ = in_stack_fffffffffffffe98;
        newError._M_str = (char *)in_stack_fffffffffffffea0;
        pcVar3 = MasterObjectHolder::addErrorString(this_00,newError);
        *(char **)(in_RCX + 2) = pcVar3;
        std::__cxx11::string::~string(in_stack_fffffffffffffe60);
        std::__cxx11::string::~string(in_stack_fffffffffffffe60);
        std::__cxx11::string::~string(in_stack_fffffffffffffe60);
        std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff3f);
        std::shared_ptr<MasterObjectHolder>::~shared_ptr((shared_ptr<MasterObjectHolder> *)0x19e9b4)
        ;
      }
      local_8 = (pointer)0x0;
    }
    else {
      CVar5 = CVar2;
      std::make_unique<helics::CoreObject>();
      pCVar4 = std::unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_>::
               operator->((unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_>
                           *)0x19ea82);
      pCVar4->valid = 0x378424ec;
      if (in_RSI == 0) {
        local_f0[0] = std::__cxx11::string::operator_cast_to_basic_string_view
                                (in_stack_fffffffffffffe60);
      }
      else {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)
                   CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
                   (char *)in_stack_fffffffffffffe68);
      }
      bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty(local_f0);
      if (bVar1) {
        if (in_RDX == 0) {
          std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffffe60);
        }
        else {
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    ((basic_string_view<char,_std::char_traits<char>_> *)
                     CONCAT44(CVar2,in_stack_fffffffffffffe70),(char *)in_stack_fffffffffffffe68);
        }
        configureString._M_str = in_stack_fffffffffffffe88;
        configureString._M_len = in_stack_fffffffffffffe80;
        helics::CoreFactory::create(type_00,configureString);
        std::unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_>::operator->
                  ((unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_> *)
                   0x19eb56);
        std::shared_ptr<helics::Core>::operator=
                  ((shared_ptr<helics::Core> *)in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
        std::shared_ptr<helics::Core>::~shared_ptr((shared_ptr<helics::Core> *)0x19eb73);
      }
      else {
        if (in_RDX == 0) {
          std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffffe60);
        }
        else {
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    ((basic_string_view<char,_std::char_traits<char>_> *)
                     CONCAT44(in_stack_fffffffffffffe74,CVar2),(char *)in_stack_fffffffffffffe68);
        }
        helics::CoreFactory::FindOrCreate
                  (in_stack_fffffffffffffeec,in_stack_ffffffffffffff00,in_stack_fffffffffffffef0);
        std::unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_>::operator->
                  ((unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_> *)
                   0x19ec3e);
        std::shared_ptr<helics::Core>::operator=
                  ((shared_ptr<helics::Core> *)in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
        std::shared_ptr<helics::Core>::~shared_ptr((shared_ptr<helics::Core> *)0x19ec5b);
      }
      local_8 = std::unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_>::get
                          ((unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_>
                            *)in_stack_fffffffffffffe60);
      getMasterHolder();
      this = std::__shared_ptr_access<MasterObjectHolder,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<MasterObjectHolder,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x19ec83);
      std::unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_>::unique_ptr
                ((unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_> *)this,
                 (unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_> *)
                 in_stack_fffffffffffffe58);
      MasterObjectHolder::addCore
                (in_stack_fffffffffffffea0,
                 (unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_> *)
                 CONCAT44(CVar5,in_stack_fffffffffffffe98));
      std::unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_>::~unique_ptr
                ((unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_> *)this);
      std::shared_ptr<MasterObjectHolder>::~shared_ptr((shared_ptr<MasterObjectHolder> *)0x19ecc4);
      std::unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_>::~unique_ptr
                ((unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_> *)this);
    }
  }
  else {
    local_8 = (pointer)0x0;
  }
  return local_8;
}

Assistant:

HelicsCore helicsCreateCore(const char* type, const char* name, const char* initString, HelicsError* err)
{
    if ((err != nullptr) && (err->error_code != 0)) {
        return nullptr;
    }

    const helics::CoreType coretype = (type != nullptr) ? helics::core::coreTypeFromString(type) : helics::CoreType::DEFAULT;

    if (coretype == helics::CoreType::UNRECOGNIZED) {
        if (err != nullptr) {
            err->error_code = HELICS_ERROR_INVALID_ARGUMENT;
            err->message = getMasterHolder()->addErrorString(std::string("core type ") + type + " is not recognized");
        }
        return nullptr;
    }
    try {
        auto core = std::make_unique<helics::CoreObject>();
        core->valid = gCoreValidationIdentifier;
        auto nstring = AS_STRING_VIEW(name);
        if (nstring.empty()) {
            core->coreptr = helics::CoreFactory::create(coretype, AS_STRING_VIEW(initString));
        } else {
            core->coreptr = helics::CoreFactory::FindOrCreate(coretype, nstring, AS_STRING_VIEW(initString));
        }

        auto* retcore = reinterpret_cast<HelicsCore>(core.get());
        getMasterHolder()->addCore(std::move(core));
        return retcore;
    }
    catch (...) {
        helicsErrorHandler(err);
        return nullptr;
    }
}